

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

LocVar * getlocvar(FuncState *fs,int i)

{
  int iVar1;
  int idx;
  int i_local;
  FuncState *fs_local;
  
  iVar1 = (int)(fs->ls->dyd->actvar).arr[fs->firstlocal + i].idx;
  if (iVar1 < fs->nlocvars) {
    return fs->f->locvars + iVar1;
  }
  __assert_fail("idx < fs->nlocvars",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x1ca,"LocVar *getlocvar(FuncState *, int)");
}

Assistant:

static LocVar *getlocvar (FuncState *fs, int i) {
  /* convert from local stack position i to global 
   * and then retrieve the index
   * of the variable in f->locvars
   */
  int idx = fs->ls->dyd->actvar.arr[fs->firstlocal + i].idx;
  lua_assert(idx < fs->nlocvars);
  return &fs->f->locvars[idx];
}